

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O2

void deqp::sl::genCompareOp
               (ostringstream *output,char *dstVec4Var,ValueBlock *valueBlock,
               char *nonFloatNamePrefix,char *checkVarName)

{
  pointer pVVar1;
  char *pcVar2;
  bool bVar3;
  DataType DVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  int ndx;
  long lVar8;
  
  bVar3 = true;
  lVar6 = 0;
  for (lVar8 = 0;
      pVVar1 = (valueBlock->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar8 < (int)(((long)(valueBlock->values).
                           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x48);
      lVar8 = lVar8 + 1) {
    if (*(int *)((long)&pVVar1->storageType + lVar6) == 2) {
      pcVar7 = "RES = RES && ";
      if (bVar3) {
        pcVar7 = "bool RES = ";
      }
      pcVar2 = *(char **)((long)&(pVVar1->valueName)._M_dataplus._M_p + lVar6);
      if (bVar3) {
        bVar3 = false;
      }
      std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7);
      DVar4 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar1->dataType + lVar6));
      poVar5 = std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,"isOk(");
      if (DVar4 == TYPE_FLOAT) {
        pcVar7 = ", 0.05);\n";
      }
      else {
        poVar5 = std::operator<<(poVar5,nonFloatNamePrefix);
        pcVar7 = ");\n";
      }
      poVar5 = std::operator<<(poVar5,pcVar2);
      poVar5 = std::operator<<(poVar5,", ref_");
      poVar5 = std::operator<<(poVar5,pcVar2);
      std::operator<<(poVar5,pcVar7);
    }
    lVar6 = lVar6 + 0x48;
  }
  poVar5 = std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,dstVec4Var);
  pcVar7 = " = vec4(RES, RES, RES, 1.0);\n";
  if (bVar3) {
    pcVar7 = " = vec4(1.0);\n";
  }
  std::operator<<(poVar5,pcVar7);
  return;
}

Assistant:

static void genCompareOp(ostringstream& output, const char* dstVec4Var, const ShaderCase::ValueBlock& valueBlock,
						 const char* nonFloatNamePrefix, const char* checkVarName)
{
	bool isFirstOutput = true;

	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val	   = valueBlock.values[ndx];
		const char*				 valueName = val.valueName.c_str();

		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			// Check if we're only interested in one variable (then skip if not the right one).
			if (checkVarName && !deStringEqual(valueName, checkVarName))
				continue;

			// Prefix.
			if (isFirstOutput)
			{
				output << "bool RES = ";
				isFirstOutput = false;
			}
			else
				output << "RES = RES && ";

			// Generate actual comparison.
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				output << "isOk(" << valueName << ", ref_" << valueName << ", 0.05);\n";
			else
				output << "isOk(" << nonFloatNamePrefix << valueName << ", ref_" << valueName << ");\n";
		}
		// \note Uniforms are already declared in shader.
	}

	if (isFirstOutput)
		output << dstVec4Var << " = vec4(1.0);\n"; // \todo [petri] Should we give warning if not expect-failure case?
	else
		output << dstVec4Var << " = vec4(RES, RES, RES, 1.0);\n";
}